

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void sorter_shell_sort(int64_t *dst,size_t size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int64_t *piVar5;
  int64_t *piVar6;
  ulong uVar7;
  
  if (1 < size) {
    lVar2 = 0x2f;
    uVar3 = 0x5062658055d8af4e;
    while (size >> 1 < uVar3) {
      lVar1 = lVar2 * 2;
      lVar2 = lVar2 + -1;
      uVar3 = *(ulong *)(&UINT_0011a0e8 + lVar1);
    }
    while( true ) {
      piVar5 = dst + uVar3;
      piVar6 = dst;
      for (uVar7 = uVar3; uVar7 < size; uVar7 = uVar7 + 1) {
        lVar1 = dst[uVar7];
        for (lVar4 = 0; (uVar3 <= uVar7 + lVar4 && (lVar1 < piVar6[lVar4])); lVar4 = lVar4 - uVar3)
        {
          piVar5[lVar4] = piVar6[lVar4];
        }
        piVar5[lVar4] = lVar1;
        piVar5 = piVar5 + 1;
        piVar6 = piVar6 + 1;
      }
      if (uVar3 == 1) break;
      uVar3 = *(ulong *)(&UINT_0011a0e8 + lVar2 * 2);
      lVar2 = lVar2 + -1;
    }
  }
  return;
}

Assistant:

void SHELL_SORT(SORT_TYPE *dst, const size_t size) {
  /* don't bother sorting an array of size 0 or 1 */
  /* TODO: binary search to find first gap? */
  int inci = 47;
  size_t inc = shell_gaps[inci];
  size_t i;

  if (size <= 1) {
    return;
  }

  while (inc > (size >> 1)) {
    inc = shell_gaps[--inci];
  }

  while (1) {
    for (i = inc; i < size; i++) {
      SORT_TYPE temp = dst[i];
      size_t j = i;

      while ((j >= inc) && (SORT_CMP(dst[j - inc], temp) > 0)) {
        dst[j] = dst[j - inc];
        j -= inc;
      }

      dst[j] = temp;
    }

    if (inc == 1) {
      break;
    }

    inc = shell_gaps[--inci];
  }
}